

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * rightJustifyZero_abi_cxx11_(string *__return_storage_ptr__,int input,int width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream s;
  ostream local_190 [376];
  int local_18;
  int local_14;
  int width_local;
  int input_local;
  
  local_18 = width;
  local_14 = input;
  _width_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var2 = std::setw(local_18);
  poVar3 = std::operator<<(local_190,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  std::ostream::operator<<(poVar3,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string rightJustifyZero (const int input, const int width)
{
  std::stringstream s;
  s << std::setw (width) << std::setfill ('0') << input;
  return s.str ();
}